

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trmm.cpp
# Opt level: O3

double benchmark<remora::triangular_tag<false,false>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                 (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                  *A,matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *B,matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *C)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  undefined8 local_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar3 = 10;
  dVar4 = 1.79769313486232e+308;
  do {
    dVar1 = Timer::now(true);
    local_78 = *(undefined8 *)(A + 0x10);
    local_50 = *(undefined8 *)B;
    local_48 = *(undefined8 *)(B + 8);
    local_58 = *(undefined8 *)(B + 0x10);
    local_70 = *(undefined8 *)A;
    uStack_68 = *(undefined8 *)(A + 8);
    local_38 = 0x3ff0000000000000;
    local_90 = *(undefined4 *)C;
    uStack_8c = *(undefined4 *)(C + 4);
    uStack_88 = *(undefined4 *)(C + 8);
    uStack_84 = *(undefined4 *)(C + 0xc);
    local_98 = *(undefined8 *)(C + 0x10);
    local_80 = local_90;
    uStack_7c = uStack_8c;
    local_60 = local_70;
    local_40 = local_48;
    remora::
    matrix_matrix_prod<remora::dense_triangular_proxy<double_const,remora::column_major,remora::triangular_tag<false,false>,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
    ::
    plus_assign_to<remora::dense_matrix_adaptor<double,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>>
              ((matrix_matrix_prod<remora::dense_triangular_proxy<double_const,remora::column_major,remora::triangular_tag<false,false>,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                *)&local_78,&local_98);
    dVar2 = Timer::now(true);
    dVar5 = 0.0;
    if (0.0 <= dVar2 - dVar1) {
      dVar5 = dVar2 - dVar1;
    }
    if (dVar4 <= dVar5) {
      dVar5 = dVar4;
    }
    lVar3 = lVar3 + -1;
    dVar4 = dVar5;
  } while (lVar3 != 0);
  return (((((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)(B + 8) >> 0x20)) -
            1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)*(undefined8 *)(B + 8)) - 4503599627370496.0)) *
          (((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)(A + 8) >> 0x20)) -
           1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)*(undefined8 *)(A + 8)) - 4503599627370496.0)) *
          (((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)A >> 0x20)) -
           1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)*(undefined8 *)A) - 4503599627370496.0)) * 0.5) / dVar5)
         * 0.0009765625 * 0.0009765625;
}

Assistant:

double benchmark(
	matrix_expression<AMat, cpu_tag> const& A,
	matrix_expression<BMat, cpu_tag> const& B,
	matrix_expression<CMat, cpu_tag> & C
){
	double minTime = std::numeric_limits<double>::max();
	for(std::size_t i = 0; i != 10; ++i){
		Timer time;
		noalias(C) += triangular_prod<Triangular>(A,B);
		minTime = std::min(minTime,time.stop());
	}
	return (0.5*A().size1()*A().size2()*B().size2())/minTime/1024/1024;
}